

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O1

void __thiscall SemanticTypes::visit(SemanticTypes *this,SignNode *signNode)

{
  int iVar1;
  ExpNode *pEVar2;
  
  pEVar2 = signNode->exp;
  if (pEVar2 == (ExpNode *)0x0) {
    visit((SemanticTypes *)signNode);
    return;
  }
  (*(pEVar2->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar2,this);
  pEVar2 = signNode->exp;
  iVar1 = pEVar2->type;
  if (iVar1 == 0xb) {
    if (-1 < pEVar2->arraySize) goto LAB_00111070;
  }
  else if ((-1 < pEVar2->arraySize) || (iVar1 != 0xc)) goto LAB_00111070;
  if (pEVar2->pointer != true) {
    (signNode->super_ExpNode).type = iVar1;
    (signNode->super_ExpNode).typeLexeme = pEVar2->typeLexeme;
    (signNode->super_ExpNode).arraySize = -1;
    (signNode->super_ExpNode).lValue = false;
    (signNode->super_ExpNode).pointer = false;
    return;
  }
LAB_00111070:
  visit((SemanticTypes *)signNode);
  return;
}

Assistant:

void SemanticTypes::visit(SignNode *signNode) {
    if (signNode->getExp()) {
        signNode->getExp()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - signNode] INVALID EXPRESSION, line %d\n", signNode->getLine());
        return;
    }

    bool isArray = signNode->getExp()->getArraySize() > -1;
    if ((signNode->getExp()->getType() != INT && signNode->getExp()->getType() != FLOAT) || isArray ||
        signNode->getExp()->isPointer()) {
        fprintf(stderr, "[SEMANTIC ERROR - signNode] CANNOT NEGATIVE A NON NUMERIC VALUE, line %d\n",
                signNode->getLine());
        return;
    }

    signNode->setType(signNode->getExp()->getType());
    signNode->setTypeLexeme(signNode->getExp()->getTypeLexeme());
    signNode->setPointer(false);
    signNode->setArraySize(-1);
    signNode->setLValue(false);
}